

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O2

TestCaseResultPtr __thiscall
ResultToJUnitHandler::startTestCaseResult(ResultToJUnitHandler *this,char *casePath)

{
  TestCaseResultData *this_00;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  TestCaseResultPtr TVar1;
  
  this_00 = (TestCaseResultData *)operator_new(0x60);
  xe::TestCaseResultData::TestCaseResultData(this_00,in_RDX);
  de::SharedPtr<xe::TestCaseResultData>::SharedPtr
            ((SharedPtr<xe::TestCaseResultData> *)this,this_00);
  TVar1.m_state = extraout_RDX;
  TVar1.m_ptr = (TestCaseResultData *)this;
  return TVar1;
}

Assistant:

xe::TestCaseResultPtr startTestCaseResult (const char* casePath)
	{
		return xe::TestCaseResultPtr(new xe::TestCaseResultData(casePath));
	}